

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_cfd_address.cpp
# Opt level: O0

void __thiscall
AddressFactory_Constructor_type_Test::TestBody(AddressFactory_Constructor_type_Test *this)

{
  bool bVar1;
  undefined1 uVar2;
  undefined1 uVar3;
  undefined1 uVar4;
  undefined1 uVar5;
  undefined1 uVar6;
  char *pcVar7;
  CfdException *anon_var_0_3;
  bool gtest_caught_expected_3;
  ConstCharPtr gtest_msg_3;
  AddressFactory factory_13;
  CfdException *anon_var_0_2;
  bool gtest_caught_expected_2;
  ConstCharPtr gtest_msg_2;
  AddressFactory factory_12;
  CfdException *anon_var_0_1;
  bool gtest_caught_expected_1;
  ConstCharPtr gtest_msg_1;
  AddressFactory factory_11;
  CfdException *anon_var_0;
  bool gtest_caught_expected;
  ConstCharPtr gtest_msg;
  AddressFactory factory_10;
  AssertionResult gtest_ar_5;
  AssertionResult gtest_ar_4;
  Address address_2;
  AddressFactory factory_9;
  AssertionResult gtest_ar_3;
  AssertionResult gtest_ar_2;
  Address address_1;
  AddressFactory factory_8;
  AssertionResult gtest_ar_1;
  AssertionResult gtest_ar;
  Address address;
  AddressFactory factory_7;
  Pubkey pubkey;
  AddressFactory factory_6;
  AddressFactory factory_5;
  AddressFactory factory_4;
  AddressFactory factory_3;
  AddressFactory factory_2;
  AddressFactory factory_1;
  AddressFactory factory;
  undefined1 in_stack_fffffffffffff0b0;
  undefined1 in_stack_fffffffffffff0b1;
  undefined1 in_stack_fffffffffffff0b2;
  undefined1 in_stack_fffffffffffff0b3;
  undefined1 in_stack_fffffffffffff0b4;
  undefined1 in_stack_fffffffffffff0b5;
  undefined1 in_stack_fffffffffffff0b6;
  undefined1 in_stack_fffffffffffff0b7;
  NetType *in_stack_fffffffffffff0b8;
  undefined4 in_stack_fffffffffffff0c0;
  undefined4 in_stack_fffffffffffff0c4;
  char *in_stack_fffffffffffff0c8;
  AssertHelper local_ed8;
  Message local_ed0 [2];
  Pubkey local_ec0 [15];
  byte local_d41;
  ConstCharPtr local_d40;
  AddressFactory local_d38;
  AssertHelper local_d10;
  Message local_d08 [2];
  Pubkey local_cf8 [15];
  byte local_b79;
  ConstCharPtr local_b78;
  AddressFactory local_b70;
  AssertHelper local_b48;
  Message local_b40 [2];
  Pubkey local_b30 [15];
  byte local_9b1;
  ConstCharPtr local_9b0;
  AddressFactory local_9a8;
  AssertHelper local_980;
  Message local_978 [2];
  Pubkey local_968 [15];
  byte local_7e9;
  ConstCharPtr local_7e8;
  AddressFactory local_7e0;
  AssertHelper local_7b8;
  Message local_7b0;
  undefined4 local_7a8;
  WitnessVersion local_7a4;
  AssertionResult local_7a0;
  AssertHelper local_790;
  Message local_788;
  undefined4 local_780;
  NetType local_77c;
  AssertionResult local_778;
  Pubkey local_768 [15];
  AddressFactory local_5f0;
  AssertHelper local_5c8;
  Message local_5c0;
  undefined4 local_5b8;
  WitnessVersion local_5b4;
  AssertionResult local_5b0;
  AssertHelper local_5a0;
  Message local_598;
  undefined4 local_590;
  NetType local_58c;
  AssertionResult local_588;
  Pubkey local_578 [15];
  AddressFactory local_400;
  AssertHelper local_3d8;
  Message local_3d0;
  undefined4 local_3c8;
  WitnessVersion local_3c4;
  AssertionResult local_3c0;
  AssertHelper local_3b0;
  Message local_3a8;
  undefined4 local_3a0;
  NetType local_39c;
  AssertionResult local_398;
  Pubkey local_388 [15];
  AddressFactory local_210;
  allocator local_1e1;
  string local_1e0 [32];
  Pubkey local_1c0;
  AssertHelper local_1a8;
  Message local_1a0;
  AddressFactory local_198;
  AssertHelper local_170;
  Message local_168;
  AddressFactory local_160;
  AssertHelper local_138;
  Message local_130;
  AddressFactory local_128;
  AssertHelper local_100;
  Message local_f8;
  AddressFactory local_f0;
  AssertHelper local_c8;
  Message local_c0;
  AddressFactory local_b8;
  AssertHelper local_90;
  Message local_88;
  AddressFactory local_80;
  AssertHelper local_58;
  Message local_50 [2];
  AddressFactory local_40;
  
  bVar1 = testing::internal::AlwaysTrue();
  if (bVar1) {
    bVar1 = testing::internal::AlwaysTrue();
    if (bVar1) {
      cfd::AddressFactory::AddressFactory(&local_40,kMainnet);
      cfd::AddressFactory::~AddressFactory((AddressFactory *)0x17fcfd);
    }
  }
  else {
    testing::Message::Message(local_50);
    testing::internal::AssertHelper::AssertHelper
              (&local_58,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/p2pderivatives[P]cfd-js/external/cfd/test/test_cfd_address.cpp"
               ,0x2b,
               "Expected: AddressFactory factory(NetType::kMainnet) doesn\'t throw an exception.\n  Actual: it throws."
              );
    testing::internal::AssertHelper::operator=(&local_58,local_50);
    testing::internal::AssertHelper::~AssertHelper(&local_58);
    testing::Message::~Message((Message *)0x17fda0);
  }
  bVar1 = testing::internal::AlwaysTrue();
  if (bVar1) {
    bVar1 = testing::internal::AlwaysTrue();
    if (bVar1) {
      cfd::AddressFactory::AddressFactory(&local_80,kTestnet);
      cfd::AddressFactory::~AddressFactory((AddressFactory *)0x17fe2c);
    }
  }
  else {
    testing::Message::Message(&local_88);
    testing::internal::AssertHelper::AssertHelper
              (&local_90,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/p2pderivatives[P]cfd-js/external/cfd/test/test_cfd_address.cpp"
               ,0x2c,
               "Expected: AddressFactory factory(NetType::kTestnet) doesn\'t throw an exception.\n  Actual: it throws."
              );
    testing::internal::AssertHelper::operator=(&local_90,&local_88);
    testing::internal::AssertHelper::~AssertHelper(&local_90);
    testing::Message::~Message((Message *)0x17fecf);
  }
  bVar1 = testing::internal::AlwaysTrue();
  if (bVar1) {
    bVar1 = testing::internal::AlwaysTrue();
    if (bVar1) {
      cfd::AddressFactory::AddressFactory(&local_b8,kRegtest);
      cfd::AddressFactory::~AddressFactory((AddressFactory *)0x17ff5b);
    }
  }
  else {
    testing::Message::Message(&local_c0);
    testing::internal::AssertHelper::AssertHelper
              (&local_c8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/p2pderivatives[P]cfd-js/external/cfd/test/test_cfd_address.cpp"
               ,0x2d,
               "Expected: AddressFactory factory(NetType::kRegtest) doesn\'t throw an exception.\n  Actual: it throws."
              );
    testing::internal::AssertHelper::operator=(&local_c8,&local_c0);
    testing::internal::AssertHelper::~AssertHelper(&local_c8);
    testing::Message::~Message((Message *)0x17fffe);
  }
  bVar1 = testing::internal::AlwaysTrue();
  if (bVar1) {
    bVar1 = testing::internal::AlwaysTrue();
    if (bVar1) {
      cfd::AddressFactory::AddressFactory(&local_f0,kLiquidV1);
      cfd::AddressFactory::~AddressFactory((AddressFactory *)0x18008a);
    }
  }
  else {
    testing::Message::Message(&local_f8);
    testing::internal::AssertHelper::AssertHelper
              (&local_100,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/p2pderivatives[P]cfd-js/external/cfd/test/test_cfd_address.cpp"
               ,0x2e,
               "Expected: AddressFactory factory(NetType::kLiquidV1) doesn\'t throw an exception.\n  Actual: it throws."
              );
    testing::internal::AssertHelper::operator=(&local_100,&local_f8);
    testing::internal::AssertHelper::~AssertHelper(&local_100);
    testing::Message::~Message((Message *)0x18012d);
  }
  bVar1 = testing::internal::AlwaysTrue();
  if (bVar1) {
    bVar1 = testing::internal::AlwaysTrue();
    if (bVar1) {
      cfd::AddressFactory::AddressFactory(&local_128,kElementsRegtest);
      cfd::AddressFactory::~AddressFactory((AddressFactory *)0x1801b9);
    }
  }
  else {
    testing::Message::Message(&local_130);
    testing::internal::AssertHelper::AssertHelper
              (&local_138,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/p2pderivatives[P]cfd-js/external/cfd/test/test_cfd_address.cpp"
               ,0x2f,
               "Expected: AddressFactory factory(NetType::kElementsRegtest) doesn\'t throw an exception.\n  Actual: it throws."
              );
    testing::internal::AssertHelper::operator=(&local_138,&local_130);
    testing::internal::AssertHelper::~AssertHelper(&local_138);
    testing::Message::~Message((Message *)0x18025c);
  }
  bVar1 = testing::internal::AlwaysTrue();
  if (bVar1) {
    bVar1 = testing::internal::AlwaysTrue();
    if (bVar1) {
      cfd::AddressFactory::AddressFactory(&local_160,kCustomChain);
      cfd::AddressFactory::~AddressFactory((AddressFactory *)0x1802e8);
    }
  }
  else {
    testing::Message::Message(&local_168);
    testing::internal::AssertHelper::AssertHelper
              (&local_170,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/p2pderivatives[P]cfd-js/external/cfd/test/test_cfd_address.cpp"
               ,0x30,
               "Expected: AddressFactory factory(NetType::kCustomChain) doesn\'t throw an exception.\n  Actual: it throws."
              );
    testing::internal::AssertHelper::operator=(&local_170,&local_168);
    testing::internal::AssertHelper::~AssertHelper(&local_170);
    testing::Message::~Message((Message *)0x18038b);
  }
  bVar1 = testing::internal::AlwaysTrue();
  if (bVar1) {
    bVar1 = testing::internal::AlwaysTrue();
    if (bVar1) {
      cfd::AddressFactory::AddressFactory(&local_198,kCustomChain);
      cfd::AddressFactory::~AddressFactory((AddressFactory *)0x180417);
    }
  }
  else {
    testing::Message::Message(&local_1a0);
    testing::internal::AssertHelper::AssertHelper
              (&local_1a8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/p2pderivatives[P]cfd-js/external/cfd/test/test_cfd_address.cpp"
               ,0x31,
               "Expected: AddressFactory factory(NetType::kNetTypeNum) doesn\'t throw an exception.\n  Actual: it throws."
              );
    testing::internal::AssertHelper::operator=(&local_1a8,&local_1a0);
    testing::internal::AssertHelper::~AssertHelper(&local_1a8);
    testing::Message::~Message((Message *)0x1804ba);
  }
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            (local_1e0,"027592aab5d43618dda13fba71e3993cd7517a712d3da49664c06ee1bd3d1f70af",
             &local_1e1);
  cfd::core::Pubkey::Pubkey(&local_1c0,local_1e0);
  std::__cxx11::string::~string(local_1e0);
  std::allocator<char>::~allocator((allocator<char> *)&local_1e1);
  cfd::AddressFactory::AddressFactory(&local_210,kMainnet);
  cfd::AddressFactory::CreateP2pkhAddress(local_388);
  local_39c = cfd::core::Address::GetNetType((Address *)local_388);
  local_3a0 = 0;
  testing::internal::EqHelper<false>::Compare<cfd::core::NetType,cfd::core::NetType>
            (in_stack_fffffffffffff0c8,
             (char *)CONCAT44(in_stack_fffffffffffff0c4,in_stack_fffffffffffff0c0),
             in_stack_fffffffffffff0b8,
             (NetType *)
             CONCAT17(in_stack_fffffffffffff0b7,
                      CONCAT16(in_stack_fffffffffffff0b6,
                               CONCAT15(in_stack_fffffffffffff0b5,
                                        CONCAT14(in_stack_fffffffffffff0b4,
                                                 CONCAT13(in_stack_fffffffffffff0b3,
                                                          CONCAT12(in_stack_fffffffffffff0b2,
                                                                   CONCAT11(
                                                  in_stack_fffffffffffff0b1,
                                                  in_stack_fffffffffffff0b0))))))));
  bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_398);
  if (!bVar1) {
    testing::Message::Message(&local_3a8);
    pcVar7 = testing::AssertionResult::failure_message((AssertionResult *)0x1806d7);
    testing::internal::AssertHelper::AssertHelper
              (&local_3b0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/p2pderivatives[P]cfd-js/external/cfd/test/test_cfd_address.cpp"
               ,0x38,pcVar7);
    testing::internal::AssertHelper::operator=(&local_3b0,&local_3a8);
    testing::internal::AssertHelper::~AssertHelper(&local_3b0);
    testing::Message::~Message((Message *)0x180734);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x18078c);
  local_3c4 = cfd::core::Address::GetWitnessVersion((Address *)local_388);
  local_3c8 = 0xffffffff;
  testing::internal::EqHelper<false>::Compare<cfd::core::WitnessVersion,cfd::core::WitnessVersion>
            (in_stack_fffffffffffff0c8,
             (char *)CONCAT44(in_stack_fffffffffffff0c4,in_stack_fffffffffffff0c0),
             (WitnessVersion *)in_stack_fffffffffffff0b8,
             (WitnessVersion *)
             CONCAT17(in_stack_fffffffffffff0b7,
                      CONCAT16(in_stack_fffffffffffff0b6,
                               CONCAT15(in_stack_fffffffffffff0b5,
                                        CONCAT14(in_stack_fffffffffffff0b4,
                                                 CONCAT13(in_stack_fffffffffffff0b3,
                                                          CONCAT12(in_stack_fffffffffffff0b2,
                                                                   CONCAT11(
                                                  in_stack_fffffffffffff0b1,
                                                  in_stack_fffffffffffff0b0))))))));
  bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_3c0);
  if (!bVar1) {
    testing::Message::Message(&local_3d0);
    pcVar7 = testing::AssertionResult::failure_message((AssertionResult *)0x18084b);
    testing::internal::AssertHelper::AssertHelper
              (&local_3d8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/p2pderivatives[P]cfd-js/external/cfd/test/test_cfd_address.cpp"
               ,0x39,pcVar7);
    testing::internal::AssertHelper::operator=(&local_3d8,&local_3d0);
    testing::internal::AssertHelper::~AssertHelper(&local_3d8);
    testing::Message::~Message((Message *)0x1808a8);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x180900);
  cfd::core::Address::~Address
            ((Address *)
             CONCAT17(in_stack_fffffffffffff0b7,
                      CONCAT16(in_stack_fffffffffffff0b6,
                               CONCAT15(in_stack_fffffffffffff0b5,
                                        CONCAT14(in_stack_fffffffffffff0b4,
                                                 CONCAT13(in_stack_fffffffffffff0b3,
                                                          CONCAT12(in_stack_fffffffffffff0b2,
                                                                   CONCAT11(
                                                  in_stack_fffffffffffff0b1,
                                                  in_stack_fffffffffffff0b0))))))));
  cfd::AddressFactory::~AddressFactory((AddressFactory *)0x18091a);
  cfd::AddressFactory::AddressFactory(&local_400,kTestnet);
  cfd::AddressFactory::CreateP2pkhAddress(local_578);
  local_58c = cfd::core::Address::GetNetType((Address *)local_578);
  local_590 = 1;
  testing::internal::EqHelper<false>::Compare<cfd::core::NetType,cfd::core::NetType>
            (in_stack_fffffffffffff0c8,
             (char *)CONCAT44(in_stack_fffffffffffff0c4,in_stack_fffffffffffff0c0),
             in_stack_fffffffffffff0b8,
             (NetType *)
             CONCAT17(in_stack_fffffffffffff0b7,
                      CONCAT16(in_stack_fffffffffffff0b6,
                               CONCAT15(in_stack_fffffffffffff0b5,
                                        CONCAT14(in_stack_fffffffffffff0b4,
                                                 CONCAT13(in_stack_fffffffffffff0b3,
                                                          CONCAT12(in_stack_fffffffffffff0b2,
                                                                   CONCAT11(
                                                  in_stack_fffffffffffff0b1,
                                                  in_stack_fffffffffffff0b0))))))));
  bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_588);
  if (!bVar1) {
    testing::Message::Message(&local_598);
    pcVar7 = testing::AssertionResult::failure_message((AssertionResult *)0x180a58);
    testing::internal::AssertHelper::AssertHelper
              (&local_5a0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/p2pderivatives[P]cfd-js/external/cfd/test/test_cfd_address.cpp"
               ,0x3e,pcVar7);
    testing::internal::AssertHelper::operator=(&local_5a0,&local_598);
    testing::internal::AssertHelper::~AssertHelper(&local_5a0);
    testing::Message::~Message((Message *)0x180ab5);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x180b0d);
  local_5b4 = cfd::core::Address::GetWitnessVersion((Address *)local_578);
  local_5b8 = 0xffffffff;
  testing::internal::EqHelper<false>::Compare<cfd::core::WitnessVersion,cfd::core::WitnessVersion>
            (in_stack_fffffffffffff0c8,
             (char *)CONCAT44(in_stack_fffffffffffff0c4,in_stack_fffffffffffff0c0),
             (WitnessVersion *)in_stack_fffffffffffff0b8,
             (WitnessVersion *)
             CONCAT17(in_stack_fffffffffffff0b7,
                      CONCAT16(in_stack_fffffffffffff0b6,
                               CONCAT15(in_stack_fffffffffffff0b5,
                                        CONCAT14(in_stack_fffffffffffff0b4,
                                                 CONCAT13(in_stack_fffffffffffff0b3,
                                                          CONCAT12(in_stack_fffffffffffff0b2,
                                                                   CONCAT11(
                                                  in_stack_fffffffffffff0b1,
                                                  in_stack_fffffffffffff0b0))))))));
  bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_5b0);
  if (!bVar1) {
    testing::Message::Message(&local_5c0);
    pcVar7 = testing::AssertionResult::failure_message((AssertionResult *)0x180bcc);
    testing::internal::AssertHelper::AssertHelper
              (&local_5c8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/p2pderivatives[P]cfd-js/external/cfd/test/test_cfd_address.cpp"
               ,0x3f,pcVar7);
    testing::internal::AssertHelper::operator=(&local_5c8,&local_5c0);
    testing::internal::AssertHelper::~AssertHelper(&local_5c8);
    testing::Message::~Message((Message *)0x180c29);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x180c81);
  cfd::core::Address::~Address
            ((Address *)
             CONCAT17(in_stack_fffffffffffff0b7,
                      CONCAT16(in_stack_fffffffffffff0b6,
                               CONCAT15(in_stack_fffffffffffff0b5,
                                        CONCAT14(in_stack_fffffffffffff0b4,
                                                 CONCAT13(in_stack_fffffffffffff0b3,
                                                          CONCAT12(in_stack_fffffffffffff0b2,
                                                                   CONCAT11(
                                                  in_stack_fffffffffffff0b1,
                                                  in_stack_fffffffffffff0b0))))))));
  cfd::AddressFactory::~AddressFactory((AddressFactory *)0x180c9b);
  cfd::AddressFactory::AddressFactory(&local_5f0,kRegtest);
  cfd::AddressFactory::CreateP2pkhAddress(local_768);
  local_77c = cfd::core::Address::GetNetType((Address *)local_768);
  local_780 = 2;
  testing::internal::EqHelper<false>::Compare<cfd::core::NetType,cfd::core::NetType>
            (in_stack_fffffffffffff0c8,
             (char *)CONCAT44(in_stack_fffffffffffff0c4,in_stack_fffffffffffff0c0),
             in_stack_fffffffffffff0b8,
             (NetType *)
             CONCAT17(in_stack_fffffffffffff0b7,
                      CONCAT16(in_stack_fffffffffffff0b6,
                               CONCAT15(in_stack_fffffffffffff0b5,
                                        CONCAT14(in_stack_fffffffffffff0b4,
                                                 CONCAT13(in_stack_fffffffffffff0b3,
                                                          CONCAT12(in_stack_fffffffffffff0b2,
                                                                   CONCAT11(
                                                  in_stack_fffffffffffff0b1,
                                                  in_stack_fffffffffffff0b0))))))));
  bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_778);
  if (!bVar1) {
    testing::Message::Message(&local_788);
    in_stack_fffffffffffff0c8 =
         testing::AssertionResult::failure_message((AssertionResult *)0x180dd9);
    testing::internal::AssertHelper::AssertHelper
              (&local_790,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/p2pderivatives[P]cfd-js/external/cfd/test/test_cfd_address.cpp"
               ,0x44,in_stack_fffffffffffff0c8);
    testing::internal::AssertHelper::operator=(&local_790,&local_788);
    testing::internal::AssertHelper::~AssertHelper(&local_790);
    testing::Message::~Message((Message *)0x180e36);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x180e8e);
  local_7a4 = cfd::core::Address::GetWitnessVersion((Address *)local_768);
  local_7a8 = 0xffffffff;
  testing::internal::EqHelper<false>::Compare<cfd::core::WitnessVersion,cfd::core::WitnessVersion>
            (in_stack_fffffffffffff0c8,(char *)CONCAT44(local_7a4,in_stack_fffffffffffff0c0),
             (WitnessVersion *)in_stack_fffffffffffff0b8,
             (WitnessVersion *)
             CONCAT17(in_stack_fffffffffffff0b7,
                      CONCAT16(in_stack_fffffffffffff0b6,
                               CONCAT15(in_stack_fffffffffffff0b5,
                                        CONCAT14(in_stack_fffffffffffff0b4,
                                                 CONCAT13(in_stack_fffffffffffff0b3,
                                                          CONCAT12(in_stack_fffffffffffff0b2,
                                                                   CONCAT11(
                                                  in_stack_fffffffffffff0b1,
                                                  in_stack_fffffffffffff0b0))))))));
  bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_7a0);
  if (!bVar1) {
    testing::Message::Message(&local_7b0);
    pcVar7 = testing::AssertionResult::failure_message((AssertionResult *)0x180f4d);
    testing::internal::AssertHelper::AssertHelper
              (&local_7b8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/p2pderivatives[P]cfd-js/external/cfd/test/test_cfd_address.cpp"
               ,0x45,pcVar7);
    testing::internal::AssertHelper::operator=(&local_7b8,&local_7b0);
    testing::internal::AssertHelper::~AssertHelper(&local_7b8);
    testing::Message::~Message((Message *)0x180faa);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x181002);
  cfd::core::Address::~Address
            ((Address *)
             CONCAT17(in_stack_fffffffffffff0b7,
                      CONCAT16(in_stack_fffffffffffff0b6,
                               CONCAT15(in_stack_fffffffffffff0b5,
                                        CONCAT14(in_stack_fffffffffffff0b4,
                                                 CONCAT13(in_stack_fffffffffffff0b3,
                                                          CONCAT12(in_stack_fffffffffffff0b2,
                                                                   CONCAT11(
                                                  in_stack_fffffffffffff0b1,
                                                  in_stack_fffffffffffff0b0))))))));
  cfd::AddressFactory::~AddressFactory((AddressFactory *)0x18101c);
  cfd::AddressFactory::AddressFactory(&local_7e0,kLiquidV1);
  testing::internal::ConstCharPtr::ConstCharPtr(&local_7e8,"");
  uVar2 = testing::internal::ConstCharPtr::operator_cast_to_bool(&local_7e8);
  if ((bool)uVar2) {
    local_7e9 = 0;
    in_stack_fffffffffffff0b6 = testing::internal::AlwaysTrue();
    if ((bool)in_stack_fffffffffffff0b6) {
      cfd::AddressFactory::CreateP2pkhAddress(local_968);
      cfd::core::Address::~Address
                ((Address *)
                 CONCAT17(uVar2,CONCAT16(in_stack_fffffffffffff0b6,
                                         CONCAT15(in_stack_fffffffffffff0b5,
                                                  CONCAT14(in_stack_fffffffffffff0b4,
                                                           CONCAT13(in_stack_fffffffffffff0b3,
                                                                    CONCAT12(
                                                  in_stack_fffffffffffff0b2,
                                                  CONCAT11(in_stack_fffffffffffff0b1,
                                                           in_stack_fffffffffffff0b0))))))));
    }
    if ((local_7e9 & 1) == 0) {
      local_7e8.value =
           "Expected: factory.CreateP2pkhAddress(pubkey) throws an exception of type CfdException.\n  Actual: it throws nothing."
      ;
      goto LAB_0018119a;
    }
  }
  else {
LAB_0018119a:
    testing::Message::Message(local_978);
    testing::internal::AssertHelper::AssertHelper
              (&local_980,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/p2pderivatives[P]cfd-js/external/cfd/test/test_cfd_address.cpp"
               ,0x49,local_7e8.value);
    testing::internal::AssertHelper::operator=(&local_980,local_978);
    testing::internal::AssertHelper::~AssertHelper(&local_980);
    testing::Message::~Message((Message *)0x181202);
  }
  cfd::AddressFactory::~AddressFactory((AddressFactory *)0x18125a);
  cfd::AddressFactory::AddressFactory(&local_9a8,kElementsRegtest);
  testing::internal::ConstCharPtr::ConstCharPtr(&local_9b0,"");
  uVar3 = testing::internal::ConstCharPtr::operator_cast_to_bool(&local_9b0);
  if ((bool)uVar3) {
    local_9b1 = 0;
    in_stack_fffffffffffff0b4 = testing::internal::AlwaysTrue();
    if ((bool)in_stack_fffffffffffff0b4) {
      cfd::AddressFactory::CreateP2pkhAddress(local_b30);
      cfd::core::Address::~Address
                ((Address *)
                 CONCAT17(uVar2,CONCAT16(in_stack_fffffffffffff0b6,
                                         CONCAT15(uVar3,CONCAT14(in_stack_fffffffffffff0b4,
                                                                 CONCAT13(in_stack_fffffffffffff0b3,
                                                                          CONCAT12(
                                                  in_stack_fffffffffffff0b2,
                                                  CONCAT11(in_stack_fffffffffffff0b1,
                                                           in_stack_fffffffffffff0b0))))))));
    }
    if ((local_9b1 & 1) == 0) {
      local_9b0.value =
           "Expected: factory.CreateP2pkhAddress(pubkey) throws an exception of type CfdException.\n  Actual: it throws nothing."
      ;
      goto LAB_001813be;
    }
  }
  else {
LAB_001813be:
    testing::Message::Message(local_b40);
    testing::internal::AssertHelper::AssertHelper
              (&local_b48,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/p2pderivatives[P]cfd-js/external/cfd/test/test_cfd_address.cpp"
               ,0x4d,local_9b0.value);
    testing::internal::AssertHelper::operator=(&local_b48,local_b40);
    testing::internal::AssertHelper::~AssertHelper(&local_b48);
    testing::Message::~Message((Message *)0x181426);
  }
  cfd::AddressFactory::~AddressFactory((AddressFactory *)0x18147e);
  cfd::AddressFactory::AddressFactory(&local_b70,kCustomChain);
  testing::internal::ConstCharPtr::ConstCharPtr(&local_b78,"");
  uVar4 = testing::internal::ConstCharPtr::operator_cast_to_bool(&local_b78);
  if ((bool)uVar4) {
    local_b79 = 0;
    in_stack_fffffffffffff0b2 = testing::internal::AlwaysTrue();
    if ((bool)in_stack_fffffffffffff0b2) {
      cfd::AddressFactory::CreateP2pkhAddress(local_cf8);
      cfd::core::Address::~Address
                ((Address *)
                 CONCAT17(uVar2,CONCAT16(in_stack_fffffffffffff0b6,
                                         CONCAT15(uVar3,CONCAT14(in_stack_fffffffffffff0b4,
                                                                 CONCAT13(uVar4,CONCAT12(
                                                  in_stack_fffffffffffff0b2,
                                                  CONCAT11(in_stack_fffffffffffff0b1,
                                                           in_stack_fffffffffffff0b0))))))));
    }
    if ((local_b79 & 1) == 0) {
      local_b78.value =
           "Expected: (factory.CreateP2pkhAddress(pubkey)) throws an exception of type CfdException.\n  Actual: it throws nothing."
      ;
      goto LAB_001815e2;
    }
  }
  else {
LAB_001815e2:
    testing::Message::Message(local_d08);
    testing::internal::AssertHelper::AssertHelper
              (&local_d10,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/p2pderivatives[P]cfd-js/external/cfd/test/test_cfd_address.cpp"
               ,0x51,local_b78.value);
    testing::internal::AssertHelper::operator=(&local_d10,local_d08);
    testing::internal::AssertHelper::~AssertHelper(&local_d10);
    testing::Message::~Message((Message *)0x18164a);
  }
  cfd::AddressFactory::~AddressFactory((AddressFactory *)0x1816a2);
  cfd::AddressFactory::AddressFactory(&local_d38,kCustomChain);
  testing::internal::ConstCharPtr::ConstCharPtr(&local_d40,"");
  uVar5 = testing::internal::ConstCharPtr::operator_cast_to_bool(&local_d40);
  if ((bool)uVar5) {
    local_d41 = 0;
    uVar6 = testing::internal::AlwaysTrue();
    if ((bool)uVar6) {
      cfd::AddressFactory::CreateP2pkhAddress(local_ec0);
      cfd::core::Address::~Address
                ((Address *)
                 CONCAT17(uVar2,CONCAT16(in_stack_fffffffffffff0b6,
                                         CONCAT15(uVar3,CONCAT14(in_stack_fffffffffffff0b4,
                                                                 CONCAT13(uVar4,CONCAT12(
                                                  in_stack_fffffffffffff0b2,CONCAT11(uVar5,uVar6))))
                                                 ))));
    }
    if ((local_d41 & 1) != 0) goto LAB_001818b6;
    local_d40.value =
         "Expected: (factory.CreateP2pkhAddress(pubkey)) throws an exception of type CfdException.\n  Actual: it throws nothing."
    ;
  }
  testing::Message::Message(local_ed0);
  testing::internal::AssertHelper::AssertHelper
            (&local_ed8,kNonFatalFailure,
             "/workspace/llm4binary/github/license_all_cmakelists_1510/p2pderivatives[P]cfd-js/external/cfd/test/test_cfd_address.cpp"
             ,0x55,local_d40.value);
  testing::internal::AssertHelper::operator=(&local_ed8,local_ed0);
  testing::internal::AssertHelper::~AssertHelper(&local_ed8);
  testing::Message::~Message((Message *)0x18186e);
LAB_001818b6:
  cfd::AddressFactory::~AddressFactory((AddressFactory *)0x1818c3);
  cfd::core::Pubkey::~Pubkey((Pubkey *)0x1818d0);
  return;
}

Assistant:

TEST(AddressFactory, Constructor_type)
{
  EXPECT_NO_THROW(AddressFactory factory(NetType::kMainnet));
  EXPECT_NO_THROW(AddressFactory factory(NetType::kTestnet));
  EXPECT_NO_THROW(AddressFactory factory(NetType::kRegtest));
  EXPECT_NO_THROW(AddressFactory factory(NetType::kLiquidV1));
  EXPECT_NO_THROW(AddressFactory factory(NetType::kElementsRegtest));
  EXPECT_NO_THROW(AddressFactory factory(NetType::kCustomChain));
  EXPECT_NO_THROW(AddressFactory factory(NetType::kNetTypeNum));

  Pubkey pubkey = Pubkey("027592aab5d43618dda13fba71e3993cd7517a712d3da49664c06ee1bd3d1f70af");

  {
    AddressFactory factory(NetType::kMainnet);
    Address address = factory.CreateP2pkhAddress(pubkey);
    EXPECT_EQ(address.GetNetType(), NetType::kMainnet);
    EXPECT_EQ(address.GetWitnessVersion(), WitnessVersion::kVersionNone);
  }
  {
    AddressFactory factory(NetType::kTestnet);
    Address address = factory.CreateP2pkhAddress(pubkey);
    EXPECT_EQ(address.GetNetType(), NetType::kTestnet);
    EXPECT_EQ(address.GetWitnessVersion(), WitnessVersion::kVersionNone);
  }
  {
    AddressFactory factory(NetType::kRegtest);
    Address address = factory.CreateP2pkhAddress(pubkey);
    EXPECT_EQ(address.GetNetType(), NetType::kRegtest);
    EXPECT_EQ(address.GetWitnessVersion(), WitnessVersion::kVersionNone);
  }
  {
    AddressFactory factory(NetType::kLiquidV1);
    EXPECT_THROW(factory.CreateP2pkhAddress(pubkey), CfdException);
  }
  {
    AddressFactory factory(NetType::kElementsRegtest);
    EXPECT_THROW(factory.CreateP2pkhAddress(pubkey), CfdException);
  }
  {
    AddressFactory factory(NetType::kCustomChain);
    EXPECT_THROW((factory.CreateP2pkhAddress(pubkey)), CfdException);
  }
  {
    AddressFactory factory(NetType::kNetTypeNum);
    EXPECT_THROW((factory.CreateP2pkhAddress(pubkey)), CfdException);
  }
}